

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O0

QAbstractItemModel * createTableModel(QObject *parent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QStandardItemModel *pQVar5;
  QVariant local_208;
  QModelIndex local_1e8;
  undefined1 local_1d0 [24];
  QVariant local_1b8;
  QModelIndex local_198;
  undefined1 local_180 [25];
  QLatin1Char local_167;
  QChar local_166;
  QLatin1Char local_163;
  QChar local_162;
  QArrayDataPointer<char16_t> local_160;
  QString local_148;
  QString local_130;
  QString local_118;
  QVariant local_100;
  QModelIndex local_e0;
  undefined1 local_c8 [24];
  QModelIndex local_b0;
  int local_94;
  int j;
  int local_74;
  int i;
  QModelIndex local_58;
  QStandardItemModel *local_30;
  QAbstractItemModel *result;
  QObject *parent_local;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_10;
  
  local_30 = (QStandardItemModel *)0x0;
  result = (QAbstractItemModel *)parent;
  pQVar5 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar5,(QObject *)result);
  local_30 = pQVar5;
  QModelIndex::QModelIndex(&local_58);
  (**(code **)(*(long *)pQVar5 + 0xf8))(pQVar5,0,5,&local_58);
  pQVar5 = local_30;
  QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffff90);
  (**(code **)(*(long *)pQVar5 + 0x100))(pQVar5,0,3,&stack0xffffffffffffff90);
  local_74 = 0;
  while( true ) {
    pQVar5 = local_30;
    iVar1 = local_74;
    QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffff70);
    iVar3 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,&stack0xffffffffffffff70);
    if (iVar3 <= iVar1) break;
    local_94 = 0;
    while( true ) {
      pQVar5 = local_30;
      iVar1 = local_94;
      QModelIndex::QModelIndex(&local_b0);
      iVar4 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,&local_b0);
      pQVar5 = local_30;
      iVar2 = local_74;
      iVar3 = local_94;
      if (iVar4 <= iVar1) break;
      QModelIndex::QModelIndex(&local_e0);
      (**(code **)(*(long *)pQVar5 + 0x60))(local_c8,pQVar5,iVar2,iVar3,&local_e0);
      str = L"%1,%2";
      parent_local = (QObject *)anon_var_dwarf_11e4e;
      local_10 = &local_160;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_160,(Data *)0x0,L"%1,%2",5);
      QString::QString(&local_148,&local_160);
      iVar1 = local_74;
      QLatin1Char::QLatin1Char(&local_163,' ');
      QChar::QChar(&local_162,local_163);
      QString::arg(&local_130,&local_148,iVar1,0,10,local_162);
      iVar1 = local_94;
      QLatin1Char::QLatin1Char(&local_167,' ');
      QChar::QChar(&local_166,local_167);
      QString::arg(&local_118,&local_130,iVar1,0,10,local_166);
      QVariant::QVariant(&local_100,&local_118);
      (**(code **)(*(long *)pQVar5 + 0x98))(pQVar5,local_c8,&local_100,2);
      QVariant::~QVariant(&local_100);
      QString::~QString(&local_118);
      QString::~QString(&local_130);
      QString::~QString(&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_160);
      pQVar5 = local_30;
      iVar3 = local_74;
      iVar1 = local_94;
      QModelIndex::QModelIndex(&local_198);
      (**(code **)(*(long *)pQVar5 + 0x60))(local_180,pQVar5,iVar3,iVar1,&local_198);
      QVariant::QVariant(&local_1b8,local_74);
      (**(code **)(*(long *)pQVar5 + 0x98))(pQVar5,local_180,&local_1b8,0x100);
      QVariant::~QVariant(&local_1b8);
      pQVar5 = local_30;
      iVar3 = local_74;
      iVar1 = local_94;
      QModelIndex::QModelIndex(&local_1e8);
      (**(code **)(*(long *)pQVar5 + 0x60))(local_1d0,pQVar5,iVar3,iVar1,&local_1e8);
      QVariant::QVariant(&local_208,local_94);
      (**(code **)(*(long *)pQVar5 + 0x98))(pQVar5,local_1d0,&local_208,0x101);
      QVariant::~QVariant(&local_208);
      local_94 = local_94 + 1;
    }
    local_74 = local_74 + 1;
  }
  return (QAbstractItemModel *)local_30;
}

Assistant:

QAbstractItemModel *createTableModel(QObject *parent)
{
    QAbstractItemModel *result = nullptr;
#ifdef COMPLEX_MODEL_SUPPORT
    result = new ComplexModel(parent);
    result->insertRows(0, 5);
    result->insertColumns(0, 3);
    for (int i = 0; i < result->rowCount(); ++i) {
        for (int j = 0; j < result->columnCount(); ++j) {
            result->setData(result->index(i, j), QStringLiteral("%1,%2").arg(i).arg(j), Qt::EditRole);
            result->setData(result->index(i, j), i, Qt::UserRole);
            result->setData(result->index(i, j), j, Qt::UserRole + 1);
        }
    }
#endif
    return result;
}